

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_PNGFilter.cc
# Opt level: O0

void __thiscall Pl_PNGFilter::decodeSub(Pl_PNGFilter *this)

{
  uint uVar1;
  uchar *puVar2;
  uchar local_21;
  uint local_20;
  uchar left;
  uint i;
  uint bpp;
  uchar *buffer;
  Pl_PNGFilter *this_local;
  
  QTC::TC("libtests","Pl_PNGFilter decodeSub",0);
  puVar2 = this->cur_row;
  uVar1 = this->bytes_per_pixel;
  for (local_20 = 0; local_20 < this->bytes_per_row; local_20 = local_20 + 1) {
    local_21 = '\0';
    if (uVar1 <= local_20) {
      local_21 = puVar2[(ulong)(local_20 - uVar1) + 1];
    }
    puVar2[(ulong)local_20 + 1] = puVar2[(ulong)local_20 + 1] + local_21;
  }
  return;
}

Assistant:

void
Pl_PNGFilter::decodeSub()
{
    QTC::TC("libtests", "Pl_PNGFilter decodeSub");
    unsigned char* buffer = this->cur_row + 1;
    unsigned int bpp = this->bytes_per_pixel;

    for (unsigned int i = 0; i < this->bytes_per_row; ++i) {
        unsigned char left = 0;

        if (i >= bpp) {
            left = buffer[i - bpp];
        }

        buffer[i] = static_cast<unsigned char>(buffer[i] + left);
    }
}